

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void opj_mqc_bypass_enc(opj_mqc_t *mqc,OPJ_UINT32 d)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  
  if (mqc->ct == 0xdeadbeef) {
    mqc->ct = 8;
  }
  OVar1 = mqc->ct - 1;
  mqc->ct = OVar1;
  OVar2 = (d << ((byte)OVar1 & 0x1f)) + mqc->c;
  mqc->c = OVar2;
  if (OVar1 != 0) {
    return;
  }
  *mqc->bp = (OPJ_BYTE)OVar2;
  mqc->ct = 8;
  mqc->ct = (*mqc->bp != 0xff) + 7;
  mqc->bp = mqc->bp + 1;
  mqc->c = 0;
  return;
}

Assistant:

void opj_mqc_bypass_enc(opj_mqc_t *mqc, OPJ_UINT32 d)
{
    if (mqc->ct == BYPASS_CT_INIT) {
        mqc->ct = 8;
    }
    mqc->ct--;
    mqc->c = mqc->c + (d << mqc->ct);
    if (mqc->ct == 0) {
        *mqc->bp = (OPJ_BYTE)mqc->c;
        mqc->ct = 8;
        /* If the previous byte was 0xff, make sure that the next msb is 0 */
        if (*mqc->bp == 0xff) {
            mqc->ct = 7;
        }
        mqc->bp++;
        mqc->c = 0;
    }
}